

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vsra(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  uint32_t dofs;
  uint32_t aofs;
  TCGv_i64 dst;
  int64_t arg2;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  dst = tcg_temp_new_i64(tcg_ctx);
  iVar1 = get_field1(s,FLD_O_v3,FLD_C_i3);
  read_vec_element_i64(tcg_ctx,dst,(uint8_t)iVar1,'\a',MO_8);
  arg2 = 0x78;
  if ((s->fields).field_0x9 == '~') {
    arg2 = 7;
  }
  tcg_gen_andi_i64_s390x(tcg_ctx,dst,dst,arg2);
  iVar1 = get_field1(s,FLD_O_v1,FLD_C_b1);
  dofs = vec_full_reg_offset((uint8_t)iVar1);
  iVar1 = get_field1(s,FLD_O_v2,FLD_C_d4);
  aofs = vec_full_reg_offset((uint8_t)iVar1);
  tcg_gen_gvec_2i_ool_s390x(tcg_ctx,dofs,aofs,dst,0x10,0x10,0,gen_helper_gvec_vsra);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_vsra(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 shift = tcg_temp_new_i64(tcg_ctx);

    read_vec_element_i64(tcg_ctx, shift, get_field(s, v3), 7, ES_8);
    if (s->fields.op2 == 0x7e) {
        tcg_gen_andi_i64(tcg_ctx, shift, shift, 0x7);
    } else {
        tcg_gen_andi_i64(tcg_ctx, shift, shift, 0x78);
    }

    gen_gvec_2i_ool(tcg_ctx, get_field(s, v1), get_field(s, v2),
                    shift, 0, gen_helper_gvec_vsra);
    tcg_temp_free_i64(tcg_ctx, shift);
    return DISAS_NEXT;
}